

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

void mserialize::
     StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::serialize<binlog::detail::RecoverableVectorOutputStream>
               (ClockSync *t,RecoverableVectorOutputStream *ostream)

{
  uint uVar1;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  
  uVar1 = 1;
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::serialize_member<binlog::ClockSync,unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,1),(RecoverableVectorOutputStream *)0x106938);
  uVar2 = 0;
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::serialize_member<binlog::ClockSync,unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(ulong)uVar1
             ,(RecoverableVectorOutputStream *)0x106954);
  uVar3 = 0;
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::serialize_member<binlog::ClockSync,unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)((ulong)in_stack_ffffffffffffffe4 << 0x20),CONCAT44(uVar2,uVar1),
             (RecoverableVectorOutputStream *)0x106970);
  uVar4 = 0;
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::serialize_member<binlog::ClockSync,int,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)(ulong)uVar3,CONCAT44(uVar2,uVar1),
             (RecoverableVectorOutputStream *)0x10698c);
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::
  serialize_member<binlog::ClockSync,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)CONCAT44(uVar4,uVar3),CONCAT44(uVar2,uVar1),
             (RecoverableVectorOutputStream *)0x1069a8);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }